

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zePhysicalMemDestroy(ze_context_handle_t hContext,ze_physical_mem_handle_t hPhysicalMemory)

{
  ze_result_t zVar1;
  
  if (DAT_0010e6b8 != (code *)0x0) {
    zVar1 = (*DAT_0010e6b8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zePhysicalMemDestroy(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_physical_mem_handle_t hPhysicalMemory        ///< [in][release] handle of physical memory object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroy = context.zeDdiTable.PhysicalMem.pfnDestroy;
        if( nullptr != pfnDestroy )
        {
            result = pfnDestroy( hContext, hPhysicalMemory );
        }
        else
        {
            // generic implementation

        }

        return result;
    }